

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O3

void __thiscall
ot::commissioner::CommissionerImpl::Petition
          (CommissionerImpl *this,PetitionHandler *aHandler,string *aAddr,uint16_t aPort)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
  *this_00;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  format_args args_00;
  writer write;
  Error error;
  anon_class_40_2_3adf01b8 onConnected;
  writer local_188;
  string *local_180;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
  *local_178;
  undefined8 uStack_170;
  code *local_168;
  code *pcStack_160;
  string local_150;
  undefined1 local_130 [8];
  undefined1 *local_128;
  char local_120 [8];
  undefined1 local_118 [16];
  _Any_data *local_108;
  ErrorCode local_100;
  undefined1 *local_f8;
  long local_f0;
  undefined1 local_e8 [16];
  _Any_data local_d8;
  code *local_c8;
  CommissionerImpl *local_b8;
  _Any_data local_b0;
  code *local_a0;
  undefined1 local_90 [8];
  _Alloc_hider local_88;
  char local_78 [16];
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  local_68;
  
  local_f8 = local_e8;
  local_100 = kNone;
  local_f0 = 0;
  local_e8[0] = 0;
  local_180 = aAddr;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
              *)&local_d8,aHandler);
  local_b8 = this;
  iVar2 = (*(this->super_Commissioner)._vptr_Commissioner[9])(this);
  if ((char)iVar2 == '\0') {
    local_130 = (undefined1  [8])local_120;
    local_108 = (_Any_data *)aHandler;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"meshcop","");
    local_68.types_[0] = string_type;
    local_68.types_[1] = uint_type;
    pcVar3 = "starting petition: border agent = ({}, {})";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "starting petition: border agent = ({}, {})";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x2a;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 2;
    local_68.parse_funcs_[0] =
         ::fmt::v10::detail::
         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
    local_68.parse_funcs_[1] =
         ::fmt::v10::detail::
         parse_format_specs<unsigned_short,fmt::v10::detail::compile_parse_context<char>>;
    local_188.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    do {
      cVar1 = *pcVar3;
      pcVar4 = pcVar3;
      while (cVar1 != '{') {
        pcVar4 = pcVar4 + 1;
        if (pcVar4 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
          ::writer::operator()(&local_188,pcVar3,"");
          goto LAB_001b7797;
        }
        cVar1 = *pcVar4;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
      ::writer::operator()(&local_188,pcVar3,pcVar4);
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,unsigned_short>&>
                         (pcVar4,"",&local_68);
    } while (pcVar3 != "");
LAB_001b7797:
    local_68.types_ = (type  [2])(local_180->_M_dataplus)._M_p;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         (char *)local_180->_M_string_length;
    fmt.size_ = 0x2d;
    fmt.data_ = (char *)0x2a;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_68;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = (ulong)aPort;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_150,(v10 *)"starting petition: border agent = ({}, {})",fmt,args_00);
    Log(kDebug,(string *)local_130,&local_150);
    aHandler = (PetitionHandler *)local_108;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if (local_130 != (undefined1  [8])local_120) {
      operator_delete((void *)local_130);
    }
    if ((this->mBrClient).mDtlsSession.mState == kConnected) {
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
      ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
                  *)&local_b0,aHandler);
      SendPetition(this,(PetitionHandler *)&local_b0);
      if (local_a0 != (code *)0x0) {
        (*local_a0)(&local_b0,&local_b0,__destroy_functor);
      }
    }
    else {
      local_168 = (code *)0x0;
      pcStack_160 = (code *)0x0;
      local_178 = (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
                   *)0x0;
      uStack_170 = 0;
      this_00 = (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
                 *)operator_new(0x28);
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
      ::function(this_00,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
                          *)&local_d8);
      *(CommissionerImpl **)&this_00[1].super__Function_base._M_functor = local_b8;
      pcStack_160 = std::
                    _Function_handler<void_(ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:267:24)>
                    ::_M_invoke;
      local_168 = std::
                  _Function_handler<void_(ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:267:24)>
                  ::_M_manager;
      local_178 = this_00;
      (*(this->super_Commissioner)._vptr_Commissioner[4])(this,&local_178,local_180,(ulong)aPort);
      if (local_168 != (code *)0x0) {
        (*local_168)(&local_178,&local_178,3);
      }
    }
  }
  else {
    local_68.types_ = (type  [2])((ulong)local_68.types_[1] << 0x20);
    pcVar3 = "cannot petition when the commissioner is running";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "cannot petition when the commissioner is running";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x30;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    local_188.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    do {
      cVar1 = *pcVar3;
      pcVar4 = pcVar3;
      while (cVar1 != '{') {
        pcVar4 = pcVar4 + 1;
        if (pcVar4 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)&local_188,pcVar3,"");
          goto LAB_001b76f4;
        }
        cVar1 = *pcVar4;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()((writer *)&local_188,pcVar3,pcVar4);
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar4,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_68);
    } while (pcVar3 != "");
LAB_001b76f4:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_150,(v10 *)"cannot petition when the commissioner is running",
               (string_view)ZEXT816(0x30),args);
    local_130._0_4_ = 0xf;
    local_128 = local_118;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_128,local_150._M_dataplus._M_p,
               local_150._M_dataplus._M_p + local_150._M_string_length);
    local_100 = local_130._0_4_;
    std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_128);
    if (local_128 != local_118) {
      operator_delete(local_128);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
  }
  if (local_100 != kNone) {
    local_90._0_4_ = local_100;
    local_88._M_p = local_78;
    std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_f8,local_f8 + local_f0);
    local_68.types_[0] = none_type;
    local_68.types_[1] = none_type;
    if (*(long *)((long)aHandler + 0x10) == 0) {
      std::__throw_bad_function_call();
    }
    (**(code **)((long)aHandler + 0x18))
              ((_Any_data *)aHandler,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_68,
               (Error *)local_90);
    if (local_88._M_p != local_78) {
      operator_delete(local_88._M_p);
    }
  }
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  return;
}

Assistant:

void CommissionerImpl::Petition(PetitionHandler aHandler, const std::string &aAddr, uint16_t aPort)
{
    Error error;

    auto onConnected = [&, aHandler](Error aError) {
        if (aError != ErrorCode::kNone)
        {
            aHandler(nullptr, aError);
        }
        else
        {
            LOG_DEBUG(LOG_REGION_MESHCOP, "DTLS connection to border agent succeed");
            this->mState = State::kConnected;
            SendPetition(aHandler);
        }
    };

    VerifyOrExit(!IsActive(), error = ERROR_INVALID_STATE("cannot petition when the commissioner is running"));
    LOG_DEBUG(LOG_REGION_MESHCOP, "starting petition: border agent = ({}, {})", aAddr, aPort);

    if (mBrClient.IsConnected())
    {
        SendPetition(aHandler);
    }
    else
    {
        Connect(onConnected, aAddr, aPort);
    }

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(nullptr, error);
    }
}